

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_spec_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  UnitTestSource *pUVar3;
  char **in_R9;
  AssertionHelper local_1dc0;
  int local_1d90;
  AssertionReturnType<int> local_1d8c;
  Fixed local_1d88;
  ReturnTypedFixed<int> local_1c00;
  char *local_1a70;
  undefined1 local_1a68 [8];
  AssertionResult iutest_ar_9;
  int local_1a10;
  AssertionReturnType<int> local_1a0c;
  Fixed local_1a08;
  ReturnTypedFixed<int> local_1880;
  char *local_16f0;
  undefined1 local_16e8 [8];
  AssertionResult iutest_ar_8;
  undefined1 local_16b8 [4];
  int ret_2;
  AssertionHelper local_1698;
  Fixed local_1668;
  bool local_14d9;
  undefined1 local_14d8 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_1490;
  Fixed local_1460;
  bool local_12d1;
  undefined1 local_12d0 [8];
  AssertionResult iutest_ar_6;
  char *targv_2 [3];
  undefined1 local_1288 [4];
  int targc_2;
  int local_1258;
  AssertionReturnType<int> local_1254;
  Fixed local_1250;
  ReturnTypedFixed<int> local_10c8;
  char *local_f38;
  undefined1 local_f30 [8];
  AssertionResult iutest_ar_5;
  int local_ed8;
  AssertionReturnType<int> local_ed4;
  Fixed local_ed0;
  ReturnTypedFixed<int> local_d48;
  char *local_bb8;
  undefined1 local_bb0 [8];
  AssertionResult iutest_ar_4;
  undefined1 local_b80 [4];
  int ret_1;
  AssertionHelper local_b60;
  Fixed local_b30;
  bool local_9a1;
  undefined1 local_9a0 [8];
  AssertionResult iutest_ar_3;
  char *targv_1 [2];
  undefined1 local_960 [4];
  int targc_1;
  int local_930;
  AssertionReturnType<int> local_92c;
  Fixed local_928;
  ReturnTypedFixed<int> local_7a0;
  char *local_610;
  undefined1 local_608 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_5d8;
  int local_5a8;
  AssertionReturnType<int> local_5a4;
  Fixed local_5a0;
  ReturnTypedFixed<int> local_418;
  char *local_288;
  undefined1 local_280 [8];
  AssertionResult iutest_ar_1;
  undefined1 local_250 [4];
  int ret;
  AssertionHelper local_230;
  Fixed local_200;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult iutest_ar;
  char *targv [2];
  int local_1c;
  char **ppcStack_18;
  int targc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  iutest::detail::iuConsole::SetLogger(&logger.super_iuLogger);
  local_1c = 2;
  iutest_ar._32_8_ = *ppcStack_18;
  iutest::InitIrisUnitTest(&local_1c,(char **)&iutest_ar.m_result);
  iutest::detail::AlwaysZero();
  local_61 = iutest::TestFlag::IsEnableFlag(0x4000000);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_60,&local_61);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)local_60,
               (AssertionResult *)
               "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false","true",
               (char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
               ,0x32,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_230,&local_200);
    iutest::AssertionHelper::~AssertionHelper(&local_230);
    std::__cxx11::string::~string((string *)local_250);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  TestLogger::clear(&logger);
  pUVar3 = iutest::UnitTestSource::GetInstance();
  iutest_ar_1._36_4_ = iutest::UnitTestSource::Run(pUVar3);
  iutest::detail::AlwaysZero();
  local_288 = TestLogger::c_str(&logger);
  iuutil::CmpHelperSTRIN<char[24],char_const*>
            ((AssertionResult *)local_280,(iuutil *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
             "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])&local_288,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    memset(&local_5a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5a0);
    local_5a8 = 1;
    local_5a4 = iutest::AssertionReturn<int>(&local_5a8);
    iutest::AssertionHelper::Fixed::operator<<(&local_418,&local_5a0,&local_5a4);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_280);
    iutest::AssertionHelper::AssertionHelper
              (&local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
               ,0x36,pcVar2,kFatalFailure);
    argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_5d8,&local_418);
    iutest::AssertionHelper::~AssertionHelper(&local_5d8);
    iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_418);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5a0);
  }
  iutest_ar_2._37_3_ = 0;
  iutest_ar_2._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  if (iutest_ar_2._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_610 = TestLogger::c_str(&logger);
    iuutil::CmpHelperSTRNOTIN<char[17],char_const*>
              ((AssertionResult *)local_608,(iuutil *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
               "IUTEST_HAS_TUPLE",(char (*) [17])&local_610,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
    if (!bVar1) {
      memset(&local_928,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_928);
      local_930 = 1;
      local_92c = iutest::AssertionReturn<int>(&local_930);
      iutest::AssertionHelper::Fixed::operator<<(&local_7a0,&local_928,&local_92c);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_608);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_960,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                 ,0x37,pcVar2,kFatalFailure);
      argv_local._4_4_ = iutest::AssertionHelper::operator=((AssertionHelper *)local_960,&local_7a0)
      ;
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_960);
      iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_7a0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_928);
    }
    iutest_ar_2._37_3_ = 0;
    iutest_ar_2._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_608);
    if (iutest_ar_2._36_4_ == 0) {
      if (iutest_ar_1._36_4_ == 0) {
        targv_1[1]._4_4_ = 2;
        iutest_ar_3._32_8_ = *ppcStack_18;
        targv_1[0] = "--spec";
        iutest::InitIrisUnitTest((int *)((long)targv_1 + 0xc),(char **)&iutest_ar_3.m_result);
        iutest::detail::AlwaysZero();
        local_9a1 = iutest::TestFlag::IsEnableFlag(0x8000000);
        iutest::AssertionResult::Is<bool>((AssertionResult *)local_9a0,&local_9a1);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
        if (!bVar1) {
          memset(&local_b30,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_b30);
          iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                    ((string *)local_b80,(internal *)local_9a0,
                     (AssertionResult *)
                     "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","false",
                     "true",(char *)in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          iutest::AssertionHelper::AssertionHelper
                    (&local_b60,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                     ,0x40,pcVar2,kNonFatalFailure);
          iutest::AssertionHelper::operator=(&local_b60,&local_b30);
          iutest::AssertionHelper::~AssertionHelper(&local_b60);
          std::__cxx11::string::~string((string *)local_b80);
          iutest::AssertionHelper::Fixed::~Fixed(&local_b30);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
        TestLogger::clear(&logger);
        pUVar3 = iutest::UnitTestSource::GetInstance();
        iutest_ar_4._36_4_ = iutest::UnitTestSource::Run(pUVar3);
        iutest::detail::AlwaysZero();
        local_bb8 = TestLogger::c_str(&logger);
        iuutil::CmpHelperSTRNOTIN<char[24],char_const*>
                  ((AssertionResult *)local_bb0,(iuutil *)"\"IUTEST_HAS_TYPED_TEST_P\"",
                   "logger.c_str()","IUTEST_HAS_TYPED_TEST_P",(char (*) [24])&local_bb8,in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb0);
        if (!bVar1) {
          memset(&local_ed0,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_ed0);
          local_ed8 = 1;
          local_ed4 = iutest::AssertionReturn<int>(&local_ed8);
          iutest::AssertionHelper::Fixed::operator<<(&local_d48,&local_ed0,&local_ed4);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bb0);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_5.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                     ,0x44,pcVar2,kFatalFailure);
          argv_local._4_4_ =
               iutest::AssertionHelper::operator=
                         ((AssertionHelper *)&iutest_ar_5.m_result,&local_d48);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
          iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_d48);
          iutest::AssertionHelper::Fixed::~Fixed(&local_ed0);
        }
        iutest_ar_2._37_3_ = 0;
        iutest_ar_2._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bb0);
        if (iutest_ar_2._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          local_f38 = TestLogger::c_str(&logger);
          iuutil::CmpHelperSTRIN<char[17],char_const*>
                    ((AssertionResult *)local_f30,(iuutil *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
                     "IUTEST_HAS_TUPLE",(char (*) [17])&local_f38,in_R9);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f30);
          if (!bVar1) {
            memset(&local_1250,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1250);
            local_1258 = 1;
            local_1254 = iutest::AssertionReturn<int>(&local_1258);
            iutest::AssertionHelper::Fixed::operator<<(&local_10c8,&local_1250,&local_1254);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_f30);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)local_1288,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                       ,0x45,pcVar2,kFatalFailure);
            argv_local._4_4_ =
                 iutest::AssertionHelper::operator=((AssertionHelper *)local_1288,&local_10c8);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_1288);
            iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_10c8);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1250);
          }
          iutest_ar_2._37_3_ = 0;
          iutest_ar_2._36_1_ = !bVar1;
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f30);
          if (iutest_ar_2._36_4_ == 0) {
            if (iutest_ar_4._36_4_ == 0) {
              targv_2[2]._4_4_ = 3;
              iutest_ar_6._32_8_ = *ppcStack_18;
              targv_2[0] = "--feature";
              targv_2[1] = "--spec";
              iutest::InitIrisUnitTest((int *)((long)targv_2 + 0x14),(char **)&iutest_ar_6.m_result)
              ;
              iutest::detail::AlwaysZero();
              local_12d1 = iutest::TestFlag::IsEnableFlag(0x4000000);
              iutest::AssertionResult::Is<bool>((AssertionResult *)local_12d0,&local_12d1);
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12d0);
              if (!bVar1) {
                memset(&local_1460,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_1460);
                iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                          ((string *)&iutest_ar_7.m_result,(internal *)local_12d0,
                           (AssertionResult *)
                           "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)",
                           "false","true",(char *)in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                iutest::AssertionHelper::AssertionHelper
                          (&local_1490,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                           ,0x4e,pcVar2,kNonFatalFailure);
                iutest::AssertionHelper::operator=(&local_1490,&local_1460);
                iutest::AssertionHelper::~AssertionHelper(&local_1490);
                std::__cxx11::string::~string((string *)&iutest_ar_7.m_result);
                iutest::AssertionHelper::Fixed::~Fixed(&local_1460);
              }
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_12d0);
              iutest::detail::AlwaysZero();
              local_14d9 = iutest::TestFlag::IsEnableFlag(0x8000000);
              iutest::AssertionResult::Is<bool>((AssertionResult *)local_14d8,&local_14d9);
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14d8);
              if (!bVar1) {
                memset(&local_1668,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_1668);
                iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                          ((string *)local_16b8,(internal *)local_14d8,
                           (AssertionResult *)
                           "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","false"
                           ,"true",(char *)in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                iutest::AssertionHelper::AssertionHelper
                          (&local_1698,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                           ,0x4f,pcVar2,kNonFatalFailure);
                iutest::AssertionHelper::operator=(&local_1698,&local_1668);
                iutest::AssertionHelper::~AssertionHelper(&local_1698);
                std::__cxx11::string::~string((string *)local_16b8);
                iutest::AssertionHelper::Fixed::~Fixed(&local_1668);
              }
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_14d8);
              TestLogger::clear(&logger);
              pUVar3 = iutest::UnitTestSource::GetInstance();
              iutest_ar_8._36_4_ = iutest::UnitTestSource::Run(pUVar3);
              iutest::detail::AlwaysZero();
              local_16f0 = TestLogger::c_str(&logger);
              iuutil::CmpHelperSTRIN<char[24],char_const*>
                        ((AssertionResult *)local_16e8,(iuutil *)"\"IUTEST_HAS_TYPED_TEST_P\"",
                         "logger.c_str()","IUTEST_HAS_TYPED_TEST_P",(char (*) [24])&local_16f0,in_R9
                        );
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16e8);
              if (!bVar1) {
                memset(&local_1a08,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_1a08);
                local_1a10 = 1;
                local_1a0c = iutest::AssertionReturn<int>(&local_1a10);
                iutest::AssertionHelper::Fixed::operator<<(&local_1880,&local_1a08,&local_1a0c);
                pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_16e8);
                iutest::AssertionHelper::AssertionHelper
                          ((AssertionHelper *)&iutest_ar_9.m_result,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                           ,0x53,pcVar2,kFatalFailure);
                argv_local._4_4_ =
                     iutest::AssertionHelper::operator=
                               ((AssertionHelper *)&iutest_ar_9.m_result,&local_1880);
                iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_9.m_result);
                iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1880);
                iutest::AssertionHelper::Fixed::~Fixed(&local_1a08);
              }
              iutest_ar_2._37_3_ = 0;
              iutest_ar_2._36_1_ = !bVar1;
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_16e8);
              if (iutest_ar_2._36_4_ == 0) {
                iutest::detail::AlwaysZero();
                local_1a70 = TestLogger::c_str(&logger);
                iuutil::CmpHelperSTRIN<char[17],char_const*>
                          ((AssertionResult *)local_1a68,(iuutil *)"\"IUTEST_HAS_TUPLE\"",
                           "logger.c_str()","IUTEST_HAS_TUPLE",(char (*) [17])&local_1a70,in_R9);
                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1a68);
                if (!bVar1) {
                  memset(&local_1d88,0,0x188);
                  iutest::AssertionHelper::Fixed::Fixed(&local_1d88);
                  local_1d90 = 1;
                  local_1d8c = iutest::AssertionReturn<int>(&local_1d90);
                  iutest::AssertionHelper::Fixed::operator<<(&local_1c00,&local_1d88,&local_1d8c);
                  pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1a68);
                  iutest::AssertionHelper::AssertionHelper
                            (&local_1dc0,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
                             ,0x54,pcVar2,kFatalFailure);
                  argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_1dc0,&local_1c00);
                  iutest::AssertionHelper::~AssertionHelper(&local_1dc0);
                  iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1c00);
                  iutest::AssertionHelper::Fixed::~Fixed(&local_1d88);
                }
                iutest_ar_2._37_3_ = 0;
                iutest_ar_2._36_1_ = !bVar1;
                iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1a68);
                if (iutest_ar_2._36_4_ == 0) {
                  if (iutest_ar_8._36_4_ == 0) {
                    printf("*** Successful ***\n");
                    argv_local._4_4_ = 0;
                  }
                  else {
                    argv_local._4_4_ = 1;
                  }
                }
              }
            }
            else {
              argv_local._4_4_ = 1;
            }
          }
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
    (void)argv;
#if !defined(IUTEST_USE_GTEST)
    ::iutest::detail::iuConsole::SetLogger(&logger);

    {
        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 3;
        DECAL_ARGV2("--feature", "--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}